

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::DataPageHeaderV2::DataPageHeaderV2(DataPageHeaderV2 *this,DataPageHeaderV2 *other70)

{
  long in_RSI;
  TBase *in_RDI;
  Statistics *in_stack_ffffffffffffffc8;
  Statistics *this_00;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__DataPageHeaderV2_00c01a98;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__DataPageHeaderV2_00c01a98;
  this_00 = (Statistics *)(in_RDI + 5);
  Statistics::Statistics(this_00);
  _DataPageHeaderV2__isset::_DataPageHeaderV2__isset((_DataPageHeaderV2__isset *)(in_RDI + 0x19));
  *(undefined4 *)&in_RDI[1]._vptr_TBase = *(undefined4 *)(in_RSI + 8);
  *(undefined4 *)((long)&in_RDI[1]._vptr_TBase + 4) = *(undefined4 *)(in_RSI + 0xc);
  *(undefined4 *)&in_RDI[2]._vptr_TBase = *(undefined4 *)(in_RSI + 0x10);
  *(undefined4 *)((long)&in_RDI[2]._vptr_TBase + 4) = *(undefined4 *)(in_RSI + 0x14);
  *(undefined4 *)&in_RDI[3]._vptr_TBase = *(undefined4 *)(in_RSI + 0x18);
  *(undefined4 *)((long)&in_RDI[3]._vptr_TBase + 4) = *(undefined4 *)(in_RSI + 0x1c);
  *(byte *)&in_RDI[4]._vptr_TBase = *(byte *)(in_RSI + 0x20) & 1;
  Statistics::operator=(this_00,in_stack_ffffffffffffffc8);
  *(undefined1 *)&in_RDI[0x19]._vptr_TBase = *(undefined1 *)(in_RSI + 200);
  return;
}

Assistant:

DataPageHeaderV2::DataPageHeaderV2(const DataPageHeaderV2& other70) {
  num_values = other70.num_values;
  num_nulls = other70.num_nulls;
  num_rows = other70.num_rows;
  encoding = other70.encoding;
  definition_levels_byte_length = other70.definition_levels_byte_length;
  repetition_levels_byte_length = other70.repetition_levels_byte_length;
  is_compressed = other70.is_compressed;
  statistics = other70.statistics;
  __isset = other70.__isset;
}